

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_ContainsRegex_Test::Body
          (iu_MatcherFailure_x_iutest_x_ContainsRegex_Test *this)

{
  TestFlag *pTVar1;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  iuCodeMessage local_290;
  string local_260;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_1e0;
  AssertionResult iutest_ar;
  undefined1 local_198 [392];
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"[0-9]",(allocator<char> *)&local_260);
  iutest::matchers::ContainsRegex((RegexMatcher *)local_198,&local_290.m_message);
  iutest::detail::RegexMatcher::operator()
            (&iutest_ar,(RegexMatcher *)local_198,(char (*) [5])0x1e84a2);
  iutest::detail::iuRegex::~iuRegex((iuRegex *)(local_198 + 8));
  std::__cxx11::string::~string((string *)&local_290);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<char[5]>(&local_1e0,(char (*) [5])0x1e84a2);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_260,(detail *)local_1e0._M_dataplus._M_p,"ContainsRegex(\"[0-9]\")",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x326,local_260._M_dataplus._M_p);
    local_290._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_290,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"ContainsRegex: [0-9]",(allocator<char> *)&local_290);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x327,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, ContainsRegex)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", ContainsRegex("[0-9]"))
        , "ContainsRegex: [0-9]");
}